

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_coin_selection.cpp
# Opt level: O2

vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> * GetBitcoinUtxoList(void)

{
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *in_RDI;
  Txid txid;
  Utxo utxo;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> _Stack_138;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_120;
  Txid local_108;
  value_type local_e8;
  
  (in_RDI->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (in_RDI->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (in_RDI->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string
            ((string *)&local_e8,"7ca81dd22c934747f4f5ab7844178445fe931fb248e0704c062b8f4fbd3d500a",
             (allocator *)&local_120);
  cfd::core::Txid::Txid(&local_108,(string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  memset(&local_e8,0,0xd8);
  cfd::core::Txid::GetData((ByteData *)&_Stack_138,&local_108);
  cfd::core::ByteData::GetBytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_120,
             (ByteData *)&_Stack_138);
  local_e8.txid._0_8_ = *(undefined8 *)local_120._M_impl.super__Vector_impl_data._M_start;
  local_e8.txid._8_8_ = *(undefined8 *)(local_120._M_impl.super__Vector_impl_data._M_start + 8);
  local_e8.txid._16_8_ = *(undefined8 *)(local_120._M_impl.super__Vector_impl_data._M_start + 0x10);
  local_e8.txid._24_8_ = *(undefined8 *)(local_120._M_impl.super__Vector_impl_data._M_start + 0x18);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_120);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_138);
  local_e8.vout = 0;
  local_e8.amount = 0x12a05f20;
  local_e8.witness_size_max = 0x6a;
  local_e8.uscript_size_max = 0x16;
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::push_back(in_RDI,&local_e8);
  cfd::core::Txid::~Txid(&local_108);
  std::__cxx11::string::string
            ((string *)&local_e8,"30f71f39d210f7ee291b0969c6935debf11395b0935dca84d30c810a75339a0a",
             (allocator *)&local_120);
  cfd::core::Txid::Txid(&local_108,(string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  memset(&local_e8,0,0xd8);
  cfd::core::Txid::GetData((ByteData *)&_Stack_138,&local_108);
  cfd::core::ByteData::GetBytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_120,
             (ByteData *)&_Stack_138);
  local_e8.txid._0_8_ = *(undefined8 *)local_120._M_impl.super__Vector_impl_data._M_start;
  local_e8.txid._8_8_ = *(undefined8 *)(local_120._M_impl.super__Vector_impl_data._M_start + 8);
  local_e8.txid._16_8_ = *(undefined8 *)(local_120._M_impl.super__Vector_impl_data._M_start + 0x10);
  local_e8.txid._24_8_ = *(undefined8 *)(local_120._M_impl.super__Vector_impl_data._M_start + 0x18);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_120);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_138);
  local_e8.vout = 0;
  local_e8.amount = 0x4a817c8;
  local_e8.witness_size_max = 0x6a;
  local_e8.uscript_size_max = 0x16;
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::push_back(in_RDI,&local_e8);
  cfd::core::Txid::~Txid(&local_108);
  std::__cxx11::string::string
            ((string *)&local_e8,"9e1ead91c432889cb478237da974dd1e9009c9e22694fd1e3999c40a1ef59b0a",
             (allocator *)&local_120);
  cfd::core::Txid::Txid(&local_108,(string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  memset(&local_e8,0,0xd8);
  cfd::core::Txid::GetData((ByteData *)&_Stack_138,&local_108);
  cfd::core::ByteData::GetBytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_120,
             (ByteData *)&_Stack_138);
  local_e8.txid._0_8_ = *(undefined8 *)local_120._M_impl.super__Vector_impl_data._M_start;
  local_e8.txid._8_8_ = *(undefined8 *)(local_120._M_impl.super__Vector_impl_data._M_start + 8);
  local_e8.txid._16_8_ = *(undefined8 *)(local_120._M_impl.super__Vector_impl_data._M_start + 0x10);
  local_e8.txid._24_8_ = *(undefined8 *)(local_120._M_impl.super__Vector_impl_data._M_start + 0x18);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_120);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_138);
  local_e8.vout = 0;
  local_e8.amount = 1250000000;
  local_e8.witness_size_max = 0x6a;
  local_e8.uscript_size_max = 0x16;
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::push_back(in_RDI,&local_e8);
  cfd::core::Txid::~Txid(&local_108);
  std::__cxx11::string::string
            ((string *)&local_e8,"8f4af7ee42e62a3d32f25ca56f618fb2f5df3d4c3a9c59e2c3646c5535a3d40a",
             (allocator *)&local_120);
  cfd::core::Txid::Txid(&local_108,(string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  memset(&local_e8,0,0xd8);
  cfd::core::Txid::GetData((ByteData *)&_Stack_138,&local_108);
  cfd::core::ByteData::GetBytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_120,
             (ByteData *)&_Stack_138);
  local_e8.txid._0_8_ = *(undefined8 *)local_120._M_impl.super__Vector_impl_data._M_start;
  local_e8.txid._8_8_ = *(undefined8 *)(local_120._M_impl.super__Vector_impl_data._M_start + 8);
  local_e8.txid._16_8_ = *(undefined8 *)(local_120._M_impl.super__Vector_impl_data._M_start + 0x10);
  local_e8.txid._24_8_ = *(undefined8 *)(local_120._M_impl.super__Vector_impl_data._M_start + 0x18);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_120);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_138);
  local_e8.vout = 0;
  local_e8.amount = 0x2540be4;
  local_e8.witness_size_max = 0x6a;
  local_e8.uscript_size_max = 0x16;
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::push_back(in_RDI,&local_e8);
  cfd::core::Txid::~Txid(&local_108);
  std::__cxx11::string::string
            ((string *)&local_e8,"4d97d0119b90421818bff4ec9033e5199199b53358f56390cb20f8148e76f40a",
             (allocator *)&local_120);
  cfd::core::Txid::Txid(&local_108,(string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  memset(&local_e8,0,0xd8);
  cfd::core::Txid::GetData((ByteData *)&_Stack_138,&local_108);
  cfd::core::ByteData::GetBytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_120,
             (ByteData *)&_Stack_138);
  local_e8.txid._0_8_ = *(undefined8 *)local_120._M_impl.super__Vector_impl_data._M_start;
  local_e8.txid._8_8_ = *(undefined8 *)(local_120._M_impl.super__Vector_impl_data._M_start + 8);
  local_e8.txid._16_8_ = *(undefined8 *)(local_120._M_impl.super__Vector_impl_data._M_start + 0x10);
  local_e8.txid._24_8_ = *(undefined8 *)(local_120._M_impl.super__Vector_impl_data._M_start + 0x18);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_120);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_138);
  local_e8.vout = 0;
  local_e8.amount = 0x9502f90;
  local_e8.witness_size_max = 0x6a;
  local_e8.uscript_size_max = 0x16;
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::push_back(in_RDI,&local_e8);
  cfd::core::Txid::~Txid(&local_108);
  std::__cxx11::string::string
            ((string *)&local_e8,"b9720ed2265a4ced42425bffdb4ef90a473b4106811a802fce53f7c57487fa0b",
             (allocator *)&local_120);
  cfd::core::Txid::Txid(&local_108,(string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  memset(&local_e8,0,0xd8);
  cfd::core::Txid::GetData((ByteData *)&_Stack_138,&local_108);
  cfd::core::ByteData::GetBytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_120,
             (ByteData *)&_Stack_138);
  local_e8.txid._0_8_ = *(undefined8 *)local_120._M_impl.super__Vector_impl_data._M_start;
  local_e8.txid._8_8_ = *(undefined8 *)(local_120._M_impl.super__Vector_impl_data._M_start + 8);
  local_e8.txid._16_8_ = *(undefined8 *)(local_120._M_impl.super__Vector_impl_data._M_start + 0x10);
  local_e8.txid._24_8_ = *(undefined8 *)(local_120._M_impl.super__Vector_impl_data._M_start + 0x18);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_120);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_138);
  local_e8.vout = 0;
  local_e8.amount = 2500000000;
  local_e8.witness_size_max = 0x6a;
  local_e8.uscript_size_max = 0x16;
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::push_back(in_RDI,&local_e8);
  cfd::core::Txid::~Txid(&local_108);
  std::__cxx11::string::string
            ((string *)&local_e8,"0f093988839178ea5895431241cb4400fb31dd7b665a1a93cbd372336c717e0c",
             (allocator *)&local_120);
  cfd::core::Txid::Txid(&local_108,(string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  memset(&local_e8,0,0xd8);
  cfd::core::Txid::GetData((ByteData *)&_Stack_138,&local_108);
  cfd::core::ByteData::GetBytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_120,
             (ByteData *)&_Stack_138);
  local_e8.txid._0_8_ = *(undefined8 *)local_120._M_impl.super__Vector_impl_data._M_start;
  local_e8.txid._8_8_ = *(undefined8 *)(local_120._M_impl.super__Vector_impl_data._M_start + 8);
  local_e8.txid._16_8_ = *(undefined8 *)(local_120._M_impl.super__Vector_impl_data._M_start + 0x10);
  local_e8.txid._24_8_ = *(undefined8 *)(local_120._M_impl.super__Vector_impl_data._M_start + 0x18);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_120);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_138);
  local_e8.vout = 0;
  local_e8.amount = 5000000000;
  local_e8.witness_size_max = 0x6a;
  local_e8.uscript_size_max = 0x16;
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::push_back(in_RDI,&local_e8);
  cfd::core::Txid::~Txid(&local_108);
  return in_RDI;
}

Assistant:

static std::vector<Utxo> GetBitcoinUtxoList() {
  // std::string desc = "sh(wpkh([ef735203/0'/0'/7']022c2409fbf657ba25d97bb3dab5426d20677b774d4fc7bd3bfac27ff96ada3dd1))#4z2vy08x";
  constexpr uint16_t witness_size = 106; // 71 + 33 + 2
  constexpr uint16_t scriptsig_size = 22; // 20 + 2

  std::vector<Utxo> utxos;
  {
    Txid txid("7ca81dd22c934747f4f5ab7844178445fe931fb248e0704c062b8f4fbd3d500a");
    struct Utxo utxo;
    memset(&utxo, 0, sizeof(utxo));
    memcpy(utxo.txid, txid.GetData().GetBytes().data(), 32);
    utxo.vout = 0;
    utxo.amount = 312500000;
    utxo.witness_size_max = witness_size;
    utxo.uscript_size_max = scriptsig_size;
    utxos.push_back(utxo);
  }
  {
    Txid txid("30f71f39d210f7ee291b0969c6935debf11395b0935dca84d30c810a75339a0a");
    struct Utxo utxo;
    memset(&utxo, 0, sizeof(utxo));
    memcpy(utxo.txid, txid.GetData().GetBytes().data(), 32);
    utxo.vout = 0;
    utxo.amount = 78125000;
    utxo.witness_size_max = witness_size;
    utxo.uscript_size_max = scriptsig_size;
    utxos.push_back(utxo);
  }
  {
    Txid txid("9e1ead91c432889cb478237da974dd1e9009c9e22694fd1e3999c40a1ef59b0a");
    struct Utxo utxo;
    memset(&utxo, 0, sizeof(utxo));
    memcpy(utxo.txid, txid.GetData().GetBytes().data(), 32);
    utxo.vout = 0;
    utxo.amount = 1250000000;
    utxo.witness_size_max = witness_size;
    utxo.uscript_size_max = scriptsig_size;
    utxos.push_back(utxo);
  }
  {
    Txid txid("8f4af7ee42e62a3d32f25ca56f618fb2f5df3d4c3a9c59e2c3646c5535a3d40a");
    struct Utxo utxo;
    memset(&utxo, 0, sizeof(utxo));
    memcpy(utxo.txid, txid.GetData().GetBytes().data(), 32);
    utxo.vout = 0;
    utxo.amount = 39062500;
    utxo.witness_size_max = witness_size;
    utxo.uscript_size_max = scriptsig_size;
    utxos.push_back(utxo);
  }
  {
    Txid txid("4d97d0119b90421818bff4ec9033e5199199b53358f56390cb20f8148e76f40a");
    struct Utxo utxo;
    memset(&utxo, 0, sizeof(utxo));
    memcpy(utxo.txid, txid.GetData().GetBytes().data(), 32);
    utxo.vout = 0;
    utxo.amount = 156250000;
    utxo.witness_size_max = witness_size;
    utxo.uscript_size_max = scriptsig_size;
    utxos.push_back(utxo);
  }
  {
    Txid txid("b9720ed2265a4ced42425bffdb4ef90a473b4106811a802fce53f7c57487fa0b");
    struct Utxo utxo;
    memset(&utxo, 0, sizeof(utxo));
    memcpy(utxo.txid, txid.GetData().GetBytes().data(), 32);
    utxo.vout = 0;
    utxo.amount = 2500000000;
    utxo.witness_size_max = witness_size;
    utxo.uscript_size_max = scriptsig_size;
    utxos.push_back(utxo);
  }
  {
    Txid txid("0f093988839178ea5895431241cb4400fb31dd7b665a1a93cbd372336c717e0c");
    struct Utxo utxo;
    memset(&utxo, 0, sizeof(utxo));
    memcpy(utxo.txid, txid.GetData().GetBytes().data(), 32);
    utxo.vout = 0;
    utxo.amount = 5000000000;
    utxo.witness_size_max = witness_size;
    utxo.uscript_size_max = scriptsig_size;
    utxos.push_back(utxo);
  }
  return utxos;
}